

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_ctx.c
# Opt level: O1

BN_CTX * BN_CTX_new(void)

{
  BN_CTX *pBVar1;
  
  pBVar1 = (BN_CTX *)CRYPTO_zalloc(0x40);
  if (pBVar1 != (BN_CTX *)0x0) {
    *(undefined8 *)(pBVar1 + 0x20) = 0;
    *(undefined8 *)(pBVar1 + 0x28) = 0;
    *(undefined8 *)(pBVar1 + 0x10) = 0;
    *(undefined8 *)(pBVar1 + 0x18) = 0;
    *(undefined8 *)pBVar1 = 0;
    *(undefined8 *)(pBVar1 + 8) = 0;
    return pBVar1;
  }
  return (BN_CTX *)0x0;
}

Assistant:

BN_CTX *BN_CTX_new(void)
{
    BN_CTX *ret;

    if ((ret = CRYPTO_zalloc(sizeof(*ret))) == NULL) {
        //BNerr(BN_F_BN_CTX_NEW, ERR_R_MALLOC_FAILURE);
        return NULL;
    }
    /* Initialise the structure */
    BN_POOL_init(&ret->pool);
    BN_STACK_init(&ret->stack);
    return ret;
}